

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

int absl::lts_20250127::SharedCompareImpl<absl::lts_20250127::Cord>(Cord *lhs,Cord *rhs)

{
  int iVar1;
  uint uVar2;
  size_t size_to_compare;
  size_t size_to_compare_00;
  
  size_to_compare = Cord::InlineRep::size(&lhs->contents_);
  size_to_compare_00 = Cord::InlineRep::size(&rhs->contents_);
  if (size_to_compare == size_to_compare_00) {
    iVar1 = GenericCompare<int,absl::lts_20250127::Cord>(lhs,rhs,size_to_compare);
    return iVar1;
  }
  if (size_to_compare < size_to_compare_00) {
    uVar2 = GenericCompare<int,absl::lts_20250127::Cord>(lhs,rhs,size_to_compare);
    uVar2 = uVar2 | -(uint)(uVar2 == 0);
  }
  else {
    iVar1 = GenericCompare<int,absl::lts_20250127::Cord>(lhs,rhs,size_to_compare_00);
    uVar2 = iVar1 + (uint)(iVar1 == 0);
  }
  return uVar2;
}

Assistant:

inline int SharedCompareImpl(const Cord& lhs, const RHS& rhs) {
  size_t lhs_size = lhs.size();
  size_t rhs_size = rhs.size();
  if (lhs_size == rhs_size) {
    return GenericCompare<int>(lhs, rhs, lhs_size);
  }
  if (lhs_size < rhs_size) {
    auto data_comp_res = GenericCompare<int>(lhs, rhs, lhs_size);
    return data_comp_res == 0 ? -1 : data_comp_res;
  }

  auto data_comp_res = GenericCompare<int>(lhs, rhs, rhs_size);
  return data_comp_res == 0 ? +1 : data_comp_res;
}